

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llex.c
# Opt level: O0

char * txtToken(LexState *ls,int token)

{
  int token_local;
  LexState *ls_local;
  
  if (token - 0x123U < 4) {
    save(ls,0);
    ls_local = (LexState *)luaO_pushfstring(ls->L,"\'%s\'",ls->buff->buffer);
  }
  else {
    ls_local = (LexState *)luaX_token2str(ls,token);
  }
  return (char *)ls_local;
}

Assistant:

static const char *txtToken (LexState *ls, int token) {
  switch (token) {
    case TK_NAME: case TK_STRING:
    case TK_FLT: case TK_INT:
      save(ls, '\0');
      return luaO_pushfstring(ls->L, "'%s'", luaZ_buffer(ls->buff));
    default:
      return luaX_token2str(ls, token);
  }
}